

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pull.c
# Opt level: O0

void pull0_recv_cb(void *arg)

{
  long lVar1;
  nng_err nVar2;
  uint32_t pid;
  int iVar3;
  nni_aio *pnVar4;
  nni_msg *m_00;
  void *pvVar5;
  size_t count;
  nni_msg *m;
  nni_aio *as;
  nni_aio *ap;
  pull0_sock *s;
  pull0_pipe *p;
  void *arg_local;
  
  lVar1 = *(long *)((long)arg + 8);
  pnVar4 = (nni_aio *)((long)arg + 0x18);
  nVar2 = nni_aio_result(pnVar4);
  if (nVar2 == NNG_OK) {
    m_00 = nni_aio_get_msg(pnVar4);
    nni_aio_set_msg(pnVar4,(nni_msg *)0x0);
    pid = nni_pipe_id(*arg);
    nni_msg_set_pipe(m_00,pid);
    nni_mtx_lock((nni_mtx *)(lVar1 + 0x38));
    if ((*(byte *)((long)arg + 0x1e0) & 1) == 0) {
      iVar3 = nni_list_empty((nni_list *)(lVar1 + 0x20));
      if (iVar3 == 0) {
        nni_pipe_recv(*arg,pnVar4);
        pnVar4 = (nni_aio *)nni_list_first((nni_list *)(lVar1 + 0x20));
        nni_aio_list_remove(pnVar4);
        nni_mtx_unlock((nni_mtx *)(lVar1 + 0x38));
        nni_aio_set_msg(pnVar4,m_00);
        count = nni_msg_len(m_00);
        nni_aio_finish_sync(pnVar4,NNG_OK,count);
      }
      else {
        nni_list_append((nni_list *)(lVar1 + 8),arg);
        pvVar5 = nni_list_first((nni_list *)(lVar1 + 8));
        if (pvVar5 == arg) {
          nni_pollable_raise((nni_pollable *)(lVar1 + 0x60));
        }
        *(nni_msg **)((long)arg + 0x10) = m_00;
        nni_mtx_unlock((nni_mtx *)(lVar1 + 0x38));
      }
    }
    else {
      nni_mtx_unlock((nni_mtx *)(lVar1 + 0x38));
      nni_msg_free(m_00);
    }
  }
  else {
    nni_pipe_close(*arg);
  }
  return;
}

Assistant:

static void
pull0_recv_cb(void *arg)
{
	pull0_pipe *p  = arg;
	pull0_sock *s  = p->s;
	nni_aio    *ap = &p->aio;
	nni_aio    *as;
	nni_msg    *m;

	if (nni_aio_result(ap) != 0) {
		// Failed to get a message, probably the pipe is closed.
		nni_pipe_close(p->p);
		return;
	}

	// Got a message... start the put to send it up to the application.
	m = nni_aio_get_msg(ap);
	nni_aio_set_msg(ap, NULL);
	nni_msg_set_pipe(m, nni_pipe_id(p->p));

	nni_mtx_lock(&s->m);
	if (p->closed) {
		nni_mtx_unlock(&s->m);
		nni_msg_free(m);
		return;
	}
	if (nni_list_empty(&s->rq)) {
		nni_list_append(&s->pl, p);
		if (nni_list_first(&s->pl) == p) {
			nni_pollable_raise(&s->readable);
		}
		p->m = m;
		nni_mtx_unlock(&s->m);
		return;
	}
	nni_pipe_recv(p->p, ap);
	as = nni_list_first(&s->rq);
	nni_aio_list_remove(as);
	nni_mtx_unlock(&s->m);
	nni_aio_set_msg(as, m);
	nni_aio_finish_sync(as, 0, nni_msg_len(m));
}